

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O0

DecodeStatus DecodeL2RUSInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  undefined8 in_RCX;
  MCInst *in_RDX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint unaff_retaddr;
  DecodeStatus S;
  uint Op3;
  uint Op2;
  uint Op1;
  uint in_stack_ffffffffffffffd4;
  uint64_t in_stack_ffffffffffffffd8;
  uint RegNo;
  undefined4 in_stack_fffffffffffffff0;
  
  RegNo = (uint)((ulong)in_RCX >> 0x20);
  fieldFromInstruction_4(in_ESI,0,0x10);
  DVar1 = Decode3OpInstruction
                    (unaff_retaddr,&in_RDI->OpcodePub,
                     (uint *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),&in_RDX->OpcodePub);
  if (DVar1 == MCDisassembler_Success) {
    DecodeGRRegsRegisterClass
              (in_RDX,RegNo,in_stack_ffffffffffffffd8,(void *)CONCAT44(in_stack_ffffffffffffffd4,3))
    ;
    DecodeGRRegsRegisterClass
              (in_RDX,RegNo,in_stack_ffffffffffffffd8,
               (void *)CONCAT44(in_stack_ffffffffffffffd4,DVar1));
    MCOperand_CreateImm0(in_RDI,(ulong)in_stack_ffffffffffffffd4);
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeL2RUSInstruction(MCInst *Inst, unsigned Insn, uint64_t Address,
		const void *Decoder)
{
	unsigned Op1, Op2, Op3;
	DecodeStatus S =
		Decode3OpInstruction(fieldFromInstruction_4(Insn, 0, 16), &Op1, &Op2, &Op3);
	if (S == MCDisassembler_Success) {
		DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
		DecodeGRRegsRegisterClass(Inst, Op2, Address, Decoder);
		MCOperand_CreateImm0(Inst, Op3);
	}

	return S;
}